

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O0

void __thiscall WorkerThread::~WorkerThread(WorkerThread *this)

{
  bool bVar1;
  WorkerThread *in_RDI;
  packaged_task<void_()> *unaff_retaddr;
  
  stopWorker(in_RDI);
  bVar1 = std::thread::joinable(&in_RDI->workerThread);
  if (bVar1) {
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&in_RDI->taskCV);
  std::packaged_task<void_()>::~packaged_task(unaff_retaddr);
  std::thread::~thread((thread *)0x11d6de);
  return;
}

Assistant:

WorkerThread::~WorkerThread () {
	stopWorker ();

	if (workerThread.joinable ())
		workerThread.join ();
}